

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall
embree::HeightField::HeightField(HeightField *this,Ref<embree::Image> *texture,BBox3fa *bounds)

{
  RefCount *pRVar1;
  BBox<embree::Vec3fa> *in_RDX;
  undefined8 *in_RSI;
  RefCount *in_RDI;
  int in_stack_ffffffffffffff9c;
  
  RefCount::RefCount(in_RDI,in_stack_ffffffffffffff9c);
  in_RDI->_vptr_RefCount = (_func_int **)&PTR__HeightField_00441cb8;
  pRVar1 = in_RDI + 1;
  pRVar1->_vptr_RefCount = (_func_int **)*in_RSI;
  if (pRVar1->_vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*pRVar1->_vptr_RefCount + 0x10))();
  }
  BBox<embree::Vec3fa>::BBox((BBox<embree::Vec3fa> *)(in_RDI + 2),in_RDX);
  return;
}

Assistant:

HeightField (Ref<Image> texture, const BBox3fa& bounds)
      : texture(texture), bounds(bounds) {}